

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  ulong uVar2;
  scoped_padder p;
  scoped_padder sStack_58;
  char local_30 [21];
  char local_1b [3];
  char *local_18;
  
  uVar2 = msg->thread_id | 1;
  lVar1 = 0x3f;
  if (uVar2 != 0) {
    for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&sStack_58,
             (ulong)((uint)(byte)::fmt::v11::detail::do_count_digits(unsigned_long)::bsr2log10
                                 [lVar1] -
                    (uint)(msg->thread_id <
                          *(ulong *)(::fmt::v11::detail::do_count_digits(unsigned_long)::
                                     zero_or_powers_of_10 +
                                    (ulong)(byte)::fmt::v11::detail::do_count_digits(unsigned_long)
                                                 ::bsr2log10[lVar1] * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  local_18 = ::fmt::v11::detail::do_format_decimal<char,unsigned_long>(local_30,msg->thread_id,0x15)
  ;
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_18,local_1b);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }